

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c140.c
# Opt level: O2

UINT8 device_start_c140(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint uVar1;
  UINT32 UVar2;
  int iVar3;
  ushort uVar4;
  uint uVar5;
  int iVar6;
  DEV_DATA chip;
  byte bVar7;
  sbyte sVar8;
  ushort uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  
  chip.chipInf = calloc(1,0x788);
  if ((DEV_DATA *)chip.chipInf == (DEV_DATA *)0x0) {
    return 0xff;
  }
  uVar1 = cfg->clock;
  *(uint *)&((DEV_DATA *)((long)chip.chipInf + 8))->chipInf = uVar1;
  uVar5 = uVar1 / 0x120;
  *(uint *)((long)chip.chipInf + 0xc) = uVar5;
  if (cfg->srMode == '\x02') {
    uVar10 = cfg->smplRate;
    if (uVar10 <= uVar5) goto LAB_0015b477;
  }
  else {
    if (cfg->srMode != '\x01') goto LAB_0015b477;
    uVar10 = cfg->smplRate;
  }
  *(uint *)((long)chip.chipInf + 0xc) = uVar10;
  uVar5 = uVar10;
LAB_0015b477:
  *(float *)&((DEV_DATA *)((long)chip.chipInf + 0x10))->chipInf =
       ((float)uVar1 / 288.0) / (float)uVar5;
  *(UINT8 *)((long)chip.chipInf + 0x14) = cfg->flags;
  iVar6 = 0;
  for (uVar11 = 0; uVar11 != 0x100; uVar11 = uVar11 + 1) {
    bVar7 = (byte)uVar11 & 7;
    iVar12 = iVar6 >> 0x1b;
    iVar3 = -iVar12;
    if (0 < iVar12) {
      iVar3 = iVar12;
    }
    sVar8 = bVar7 + 3;
    if ((uVar11 & 7) == 0) {
      sVar8 = 4;
    }
    uVar4 = (short)(iVar3 << sVar8) + ((ushort)(0x80 << bVar7) & 0x7f00);
    uVar9 = -(uVar4 & 0xfffe);
    if (uVar11 < 0x80) {
      uVar9 = uVar4;
    }
    *(ushort *)((long)chip.chipInf + uVar11 * 2 + 0x228) = uVar9;
    iVar6 = iVar6 + 0x1000000;
  }
  c140_set_mute_mask(chip.chipInf,0);
  *(void **)chip.chipInf = chip.chipInf;
  UVar2 = *(UINT32 *)((long)chip.chipInf + 0xc);
  retDevInf->dataPtr = (DEV_DATA *)chip.chipInf;
  retDevInf->sampleRate = UVar2;
  retDevInf->devDef = &devDef;
  retDevInf->linkDevCount = 0;
  retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  return '\0';
}

Assistant:

static UINT8 device_start_c140(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	c140_state *info;
	int i;

	info = (c140_state *)calloc(1, sizeof(c140_state));
	if (info == NULL)
		return 0xFF;
	
	info->clock = cfg->clock;
	info->sample_rate = info->clock / 288;	// sample rate according to superctr
	SRATE_CUSTOM_HIGHEST(cfg->srMode, info->sample_rate, cfg->smplRate);
	info->pbase = (float)info->clock / 288.0f / (float)info->sample_rate;

	info->banking_type = cfg->flags;

	info->pRomSize = 0x00;
	info->pRom = NULL;

	for(i = 0; i < 256; i++)
	{
		UINT8 s1 = i & 7;
		UINT8 s2 = abs((INT8)i >> 3) & 0x1F;
		info->mulaw_table[i]  = (0x80 << s1) & 0xFF00;
		info->mulaw_table[i] += s2 << (s1 ? (s1+3) : 4);
		if (i & 0x80)
			info->mulaw_table[i] = -info->mulaw_table[i];
	}

	c140_set_mute_mask(info, 0x000000);
	
	info->_devData.chipInf = info;
	INIT_DEVINF(retDevInf, &info->_devData, info->sample_rate, &devDef);
	return 0x00;
}